

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  AssertionStats *this_local;
  
  ~AssertionStats(this);
  operator_delete(this);
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;